

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_Last_Test::~GslSpan_Last_Test(GslSpan_Last_Test *this)

{
  GslSpan_Last_Test *this_local;
  
  ~GslSpan_Last_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, Last) {
    int arr[5] = {1, 2, 3, 4, 5};

    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ (av.last<2> ().length (), 2);
        EXPECT_EQ (av.last (2).length (), 2);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ (av.last<0> ().length (), 0);
        EXPECT_EQ (av.last (0).length (), 0);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ (av.last<5> ().length (), 5);
        EXPECT_EQ (av.last (5).length (), 5);
    }
    {
        span<int> av;
        EXPECT_EQ (av.last<0> ().length (), 0);
        EXPECT_EQ (av.last (0).length (), 0);
    }
}